

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

void __thiscall absl::lts_20250127::AlphaNum::AlphaNum(AlphaNum *this,unsigned_long x)

{
  char *buffer;
  Nonnull<char_*> pcVar1;
  
  buffer = this->digits_;
  pcVar1 = numbers_internal::FastIntToBuffer(x,buffer);
  (this->piece_)._M_len = (long)pcVar1 - (long)buffer;
  (this->piece_)._M_str = buffer;
  return;
}

Assistant:

AlphaNum(unsigned long x)  // NOLINT(*)
      : piece_(digits_, static_cast<size_t>(
                            numbers_internal::FastIntToBuffer(x, digits_) -
                            &digits_[0])) {}